

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

uint64_t find_max_batch(vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,
                       uint32_t trigram,uint64_t max_bytes)

{
  pointer puVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t in_R10;
  const_iterator __begin2;
  pointer pIVar5;
  
  lVar2 = 1;
  do {
    uVar4 = (int)lVar2 + trigram;
    if (0xffffff < uVar4) {
LAB_0013d19a:
      uVar3 = (ulong)(0x1000000 - trigram);
      if (uVar4 < 0x1000000) {
        uVar3 = in_R10;
      }
      return uVar3;
    }
    in_R10 = 0;
    for (pIVar5 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar5 != (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)
                  ._M_impl.super__Vector_impl_data._M_finish; pIVar5 = pIVar5 + 1) {
      puVar1 = (pIVar5->run_offset_cache).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + trigram;
      in_R10 = (in_R10 - *puVar1) + puVar1[lVar2];
    }
    if (max_bytes < in_R10) {
      in_R10 = (uint64_t)((int)lVar2 + -1);
      goto LAB_0013d19a;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

uint64_t find_max_batch(const std::vector<IndexMergeHelper> &indexes,
                        uint32_t trigram, uint64_t max_bytes) {
    for (int i = 1; trigram + i < NUM_TRIGRAMS; i++) {
        uint64_t batch_bytes = 0;
        for (const auto &ndx : indexes) {
            batch_bytes += ndx.run(trigram, i).size();
        }
        if (batch_bytes > max_bytes) {
            return i - 1;
        }
    }
    return NUM_TRIGRAMS - trigram;
}